

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  long in_RDX;
  uchar *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  secp256k1_ecmult_gen_context *unaff_retaddr;
  int ret;
  secp256k1_scalar seckey_scalar;
  secp256k1_ge p;
  secp256k1_ge *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  uVar1 = 0;
  if (in_RDI == (secp256k1_ecmult_gen_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/secp256k1.c"
            ,0x260,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffff50,
               (char *)in_stack_ffffffffffffff48);
    iVar2 = 0;
  }
  else {
    memset(in_RSI,0,0x40);
    iVar2 = secp256k1_ecmult_gen_context_is_built(in_RDI);
    if (iVar2 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar1,in_stack_ffffffffffffff50),
                 (char *)in_stack_ffffffffffffff48);
      iVar2 = 0;
    }
    else if (in_RDX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar1,in_stack_ffffffffffffff50),
                 (char *)in_stack_ffffffffffffff48);
      iVar2 = 0;
    }
    else {
      iVar2 = secp256k1_ec_pubkey_create_helper
                        (unaff_retaddr,
                         (secp256k1_scalar *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (secp256k1_ge *)in_RDI,in_RSI);
      secp256k1_pubkey_save
                ((secp256k1_pubkey *)CONCAT44(iVar2,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      secp256k1_memczero(in_RSI,0x40,(uint)((iVar2 != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)0x10445a);
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    secp256k1_memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}